

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

bool __thiscall tinyxml2::XMLComment::ShallowEqual(XMLComment *this,XMLNode *compare)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *p;
  char *q;
  
  iVar2 = (*compare->_vptr_XMLNode[8])(compare);
  if ((XMLNode *)CONCAT44(extraout_var,iVar2) != (XMLNode *)0x0) {
    p = XMLNode::Value((XMLNode *)CONCAT44(extraout_var,iVar2));
    q = XMLNode::Value(&this->super_XMLNode);
    bVar1 = XMLUtil::StringEqual(p,q,0x7fffffff);
    return bVar1;
  }
  return false;
}

Assistant:

bool XMLComment::ShallowEqual( const XMLNode* compare ) const
{
    TIXMLASSERT( compare );
    const XMLComment* comment = compare->ToComment();
    return ( comment && XMLUtil::StringEqual( comment->Value(), Value() ));
}